

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall
MessageParse_TwoPartCommandOutOfOrder_Test::MessageParse_TwoPartCommandOutOfOrder_Test
          (MessageParse_TwoPartCommandOutOfOrder_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018ad80;
  return;
}

Assistant:

TEST (MessageParse, TwoPartCommandOutOfOrder) {
    using namespace pstore::broker;
    static constexpr std::uint32_t message_id = 1234;

    pstore::broker::partial_cmds cmds;
    std::unique_ptr<broker_command> c1 =
        parse (pstore::brokerface::message_type (message_id, 1, 2, " or not to be"s), cmds);
    EXPECT_EQ (cmds.size (), 1U);
    EXPECT_EQ (c1.get (), nullptr);
    std::unique_ptr<broker_command> c2 =
        parse (pstore::brokerface::message_type (message_id, 0, 2, "HELO to be"s), cmds);
    ASSERT_NE (c2.get (), nullptr);
    EXPECT_EQ (c2->verb, "HELO");
    EXPECT_EQ (c2->path, "to be or not to be");
    EXPECT_TRUE (cmds.empty ());
}